

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> * __thiscall
cs_impl::
cni_helper<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>(*)(std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&,cs::numeric_const&),std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>(*)(std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&,cs::numeric_const&)>
::_call<0,1>(_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *__return_storage_ptr__,
            void *this,vector *args,sequence<0,_1> *param_2)

{
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *__args;
  numeric *__args_1;
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> local_48;
  
  __args = try_convert_and_check<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  __args_1 = try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_1UL>::
             convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start + 1);
  std::
  function<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_const_cs::numeric_&)>
  ::operator()(&local_48,
               (function<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_const_cs::numeric_&)>
                *)this,__args,__args_1);
  __return_storage_ptr__->_M_cur = local_48._M_cur;
  __return_storage_ptr__->_M_first = local_48._M_first;
  __return_storage_ptr__->_M_last = local_48._M_last;
  __return_storage_ptr__->_M_node = local_48._M_node;
  return __return_storage_ptr__;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}